

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O2

void __thiscall irr::gui::CGUISkin::setSpriteBank(CGUISkin *this,IGUISpriteBank *bank)

{
  IGUISpriteBank *pIVar1;
  
  if (bank != (IGUISpriteBank *)0x0) {
    *(int *)(&bank->field_0x10 + (long)bank->_vptr_IGUISpriteBank[-3]) =
         *(int *)(&bank->field_0x10 + (long)bank->_vptr_IGUISpriteBank[-3]) + 1;
  }
  pIVar1 = this->SpriteBank;
  if (pIVar1 != (IGUISpriteBank *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar1->_vptr_IGUISpriteBank + (long)pIVar1->_vptr_IGUISpriteBank[-3]));
  }
  this->SpriteBank = bank;
  return;
}

Assistant:

void CGUISkin::setSpriteBank(IGUISpriteBank *bank)
{
	if (bank)
		bank->grab();

	if (SpriteBank)
		SpriteBank->drop();

	SpriteBank = bank;
}